

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# matroskaDemuxer.cpp
# Opt level: O2

int MatroskaDemuxer::matroska_ebmlnum_uint(uint8_t *data,int32_t size,uint64_t *num)

{
  int iVar1;
  uint uVar2;
  ulong uVar3;
  byte *pbVar4;
  long lVar5;
  uint uVar6;
  ulong uVar7;
  bool bVar8;
  
  uVar2 = 0xffffffff;
  if (0 < size) {
    lVar5 = 0;
    for (uVar7 = 0x80; (iVar1 = (int)lVar5, iVar1 + 1U < 9 && (((uint)uVar7 & (uint)*data) == 0));
        uVar7 = uVar7 >> 1) {
      lVar5 = lVar5 + 1;
    }
    uVar6 = iVar1 + 1;
    if ((int)uVar6 <= size && uVar6 < 9) {
      uVar3 = (ulong)((uint)*data & (uint)(uVar7 - 1));
      uVar2 = (uint)(uVar3 == uVar7 - 1);
      pbVar4 = data + 1;
      while (bVar8 = lVar5 != 0, lVar5 = lVar5 + -1, bVar8) {
        uVar2 = uVar2 + ((ulong)*pbVar4 == 0xff);
        uVar3 = uVar3 << 8 | (ulong)*pbVar4;
        pbVar4 = pbVar4 + 1;
      }
      if (iVar1 - uVar2 == -1) {
        uVar3 = 0xffffffffffffffff;
      }
      *num = uVar3;
      uVar2 = uVar6;
    }
  }
  return uVar2;
}

Assistant:

int MatroskaDemuxer::matroska_ebmlnum_uint(const uint8_t *data, const int32_t size, uint64_t *num)
{
    int read = 1, n = 1, num_ffs = 0;
    uint64_t len_mask = 0x80;

    if (size <= 0)
        return AVERROR_INVALIDDATA;

    uint64_t total = data[0];
    while (read <= 8 && !(total & len_mask))
    {
        read++;
        len_mask >>= 1;
    }
    if (read > 8)
        return AVERROR_INVALIDDATA;

    if ((total &= (len_mask - 1)) == len_mask - 1)
        num_ffs++;
    if (size < read)
        return AVERROR_INVALIDDATA;
    while (n < read)
    {
        if (data[n] == 0xff)
            num_ffs++;
        total = (total << 8) | data[n];
        n++;
    }

    if (read == num_ffs)
        *num = ULLONG_MAX;
    else
        *num = total;

    return read;
}